

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

bool __thiscall
BRDFMaterial::sample
          (BRDFMaterial *this,Vector3f *col,Hit *hit,Ray *ray,Vector3f *coe,Runtime *rt,bool emit)

{
  Vector3f *v;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  result_type rVar1;
  float fVar2;
  float f;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM2 [16];
  Vector3f hitp;
  Vector3f p2;
  Vector3f p1;
  Vector3f p0;
  Vector3f np;
  Vector3f local_cc;
  Vector3f local_c0;
  float local_b4;
  undefined1 local_b0 [12];
  undefined1 local_a4 [24];
  Vector3f local_8c;
  Vector3f local_80;
  Vector3f local_74;
  Vector3f local_68;
  Vector2f local_5c;
  Vector3f local_54;
  Vector3f local_48 [2];
  
  this_00 = rt->g;
  if (emit) {
    Vector2f::Vector2f(&local_5c,&hit->pos);
    Texture::get((Texture *)local_b0,(Vector2f *)&this->emissionColor);
    ::operator*((Vector3f *)local_b0,coe);
    Vector3f::operator+=(col,&local_cc);
  }
  v = &ray->d;
  operator-(v);
  fVar2 = Vector3f::dot(&hit->norm,&local_cc);
  if (0.0 <= fVar2) {
    ::operator*(&local_cc,hit->t);
    operator+(&ray->o,&local_cc);
    Vector3f::Vector3f(&local_68,&hit->norm);
    Vector3f::Vector3f(&local_74,0.0);
    Vector3f::Vector3f(&local_80,0.0);
    createCoordinateSystem(&local_68,&local_74,&local_80);
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    auVar7 = vcvtusi2sd_avx512f(in_XMM2,rVar1);
    auVar6._0_8_ = auVar7._0_8_ / 4294967295.0;
    auVar6._8_8_ = auVar7._8_8_;
    auVar7._0_4_ = (float)auVar6._0_8_;
    auVar7._4_12_ = auVar6._4_12_;
    if (auVar7._0_4_ < 0.0) {
      f = sqrtf(auVar7._0_4_);
    }
    else {
      auVar7 = vsqrtss_avx(auVar7,auVar7);
      f = auVar7._0_4_;
    }
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    auVar7 = vcvtusi2sd_avx512f(in_XMM2,rVar1);
    fVar5 = (float)(auVar7._0_8_ / 4294967295.0) * 3.1415927;
    fVar5 = fVar5 + fVar5;
    auVar7 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)f),ZEXT416((uint)f));
    if (auVar7._0_4_ < 0.0) {
      fVar3 = sqrtf(auVar7._0_4_);
    }
    else {
      auVar7 = vsqrtss_avx(auVar7,auVar7);
      fVar3 = auVar7._0_4_;
    }
    fVar4 = cosf(fVar5);
    fVar5 = sinf(fVar5);
    ::operator*(f,&local_8c);
    ::operator*(fVar4 * fVar3,(Vector3f *)(local_a4 + 0xc));
    operator+(&local_8c,(Vector3f *)(local_a4 + 0xc));
    ::operator*(fVar5 * fVar3,(Vector3f *)local_a4);
    operator+(&local_cc,(Vector3f *)local_a4);
    BRDF((BRDFMaterial *)local_a4,(Vector3f *)this,v,(Hit *)(local_48 + 1));
    ::operator*(coe,(Vector3f *)local_a4);
    operator/(&local_8c,f);
    operator/(&local_cc,2.0);
    Vector3f::operator=(coe,&local_cc);
    Vector3f::Vector3f(local_48,(Vector3f *)local_b0);
    Vector3f::Vector3f(&local_54,local_48 + 1);
    Vector3f::Vector3f(&local_cc,local_48);
    Vector3f::Vector3f(&local_c0,&local_54);
    local_b4 = 3.4028235e+38;
    Vector3f::operator=(&ray->o,&local_cc);
    Vector3f::operator=(v,&local_c0);
    ray->tmax = local_b4;
  }
  return 0.0 <= fVar2;
}

Assistant:

bool sample(Vector3f& col, const Hit& hit, Ray& ray, Vector3f& coe, Runtime& rt, bool emit) const override{
		RNG_TYPE& g = *rt.g;
//		float& davg = rt.davg[this->id];
//		float& favg = rt.favg[this->id];
//		if (!this->emissionColor.empty) {
//			std::cerr << emit << "?\n";
//		}
		if(emit) col += this->emissionColor.get(hit.pos) * coe;
		if (Vector3f::dot(hit.norm, -ray.d) < 0) return 0;
		Vector3f hitp = ray.pos(hit.t);
		Vector3f p0 = hit.norm, p1, p2;
		createCoordinateSystem(p0, p1, p2);
		float r = this->roughness;
#if SAMPLER == 0
		if (0)//g() % 2)
		{
			float cog = sqrtf(randf(g)), phi = randf(g) * PI * 2;
			float sinTheta = sqrtf(1 - cog * cog);
			float C = cog * 2;
			float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
			Vector3f np = cog * p0 + y * p1 + z * p2;
			Vector3f H = np - ray.d; H.normalize();
			float co = Vector3f::dot(H, p0);
			float D = expf((1 - 1.0 / (co * co)) / (r * r)) / (r * r * co * co * co);
			if (D < 0) D = 0;
			coe = coe * this->BRDF0(ray.d, np, hit) / cog;
//			coe = coe * this->BRDF0(ray.d, np, hit) / cog / 2 * 2;// *((C * C) / (C * C + D * D)) * 2;
			ray = Ray(hitp, np);
		}
		else
		{
			int fail = 0;
			while (1)
			{
				float u = randf(g);
				float co = sqrtf(1 / (1 - r * r * logf(1 - u)));
				float d = expf((1 - 1.0 / (co * co)) / (r * r)) / (r * r * co * co * co);
				//			float D = d;// / co;
				float phi = randf(g) * 2 * PI, g = sqrtf(1 - co * co);
				Vector3f H = p0 * co + (p1 * cosf(phi) + p2 * sinf(phi)) * g;
				Vector3f np = H * 2 * Vector3f::dot(H, -ray.d) + ray.d; np.normalize();
				if (Vector3f::dot(np, p0) < 0)
				{
					fail++;
					if (fail >= 20)
					{
						return 0;
					}
					continue;
				}
				//			float C = Vector3f::dot(p0, np) * 2;
				d /= Vector3f::dot(np, H) * 2;
				davg = davg * 0.95 + 0.05 * d;
				favg = favg * 0.95 + 0.05 * (1 + fail);
				coe = coe * this->BRDF(ray.d, np, hit) / d * (davg/favg) / 2;
				//				coe = coe * this->BRDF1(ray.d, np, hit) / d * davg * 2;
//				coe = coe * this->BRDF1(ray.d, np, hit) * davg / d;// *2;// *((D * D) / (C * C + D * D)) * 2;
				ray = Ray(hitp, np);
				break;
			}
		}
#elif SAMPLER == 1
		float C = sqrtf(randf(g)), phi = randf(g) * PI * 2;
		float sinTheta = sqrtf(1 - C * C);
		float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
		Vector3f np = C * p0 + y * p1 + z * p2;
		coe = coe * this->BRDF(ray.d, np, hit) / C / 2;
		ray = Ray(hitp, np);
#else
		float C = randf(g), phi = randf(g) * PI * 2;
		float sinTheta = sqrtf(1 - C * C);
		float y = sinTheta * cosf(phi), z = sinTheta * sinf(phi);
		Vector3f np = C * p0 + y * p1 + z * p2;
		coe = coe * this->BRDF(ray.d, np, hit);
		ray = Ray(hitp, np);
#endif
#undef SAMPLER
		return 1;
	}